

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::sparse_hashtable(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *this,sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                         *ht,size_type min_buckets_wanted)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *in_RSI;
  sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *in_RDI;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *in_stack_00000030;
  size_type in_stack_00000038;
  size_type in_stack_00000080;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000088;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000090;
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffa8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_28 [2];
  
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  sVar3 = in_RSI[2];
  sVar4 = in_RSI[3];
  uVar5 = in_RSI[4];
  uVar6 = in_RSI[5];
  in_RDI->enlarge_factor_ = (float)(int)uVar5;
  in_RDI->shrink_factor_ = (float)(int)((ulong)uVar5 >> 0x20);
  in_RDI->consider_shrink_ = (bool)(char)uVar6;
  in_RDI->use_empty_ = (bool)(char)((ulong)uVar6 >> 8);
  in_RDI->use_deleted_ = (bool)(char)((ulong)uVar6 >> 0x10);
  in_RDI->field_0x2b = (char)((ulong)uVar6 >> 0x18);
  in_RDI->num_ht_copies_ = (int)((ulong)uVar6 >> 0x20);
  in_RDI->enlarge_threshold_ = sVar3;
  in_RDI->shrink_threshold_ = sVar4;
  (in_RDI->super_Hasher).id_ = (int)uVar1;
  (in_RDI->super_Hasher).num_hashes_ = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(in_RDI->super_Hasher).num_compares_ = uVar2;
  uVar1 = in_RSI[6];
  uVar2 = in_RSI[7];
  in_RDI[1].super_Hasher.id_ = (int)uVar1;
  in_RDI[1].super_Hasher.num_hashes_ = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&in_RDI[1].super_Hasher.num_compares_ = uVar2;
  in_RDI[1].enlarge_threshold_ = 0;
  get_allocator(in_stack_ffffffffffffffa8);
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  sparsetable((sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)min_buckets_wanted,in_stack_00000038,in_stack_00000030);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_28);
  bucket_count((sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xd05b23);
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
            (in_RDI,(size_type)in_stack_ffffffffffffffa8);
  copy_from(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  return;
}

Assistant:

sparse_hashtable(const sparse_hashtable& ht,
                   size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        table(0, ht.get_allocator()) {
    settings.reset_thresholds(bucket_count());
    copy_from(ht, min_buckets_wanted);  // copy_from() ignores deleted entries
  }